

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int select_del(event_base *base,int fd,short old,short events,void *p)

{
  int *piVar1;
  selectop *sop;
  void *p_local;
  short events_local;
  short old_local;
  int fd_local;
  event_base *base_local;
  
  piVar1 = (int *)base->evbase;
  if ((events & 8U) == 0) {
    if (fd <= *piVar1) {
      if ((events & 2U) != 0) {
        *(ulong *)(*(long *)(piVar1 + 4) + (long)(fd / 0x40) * 8) =
             (1L << ((byte)((long)fd % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
             *(ulong *)(*(long *)(piVar1 + 4) + (long)(fd / 0x40) * 8);
      }
      if ((events & 4U) != 0) {
        *(ulong *)(*(long *)(piVar1 + 6) + (long)(fd / 0x40) * 8) =
             (1L << ((byte)((long)fd % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
             *(ulong *)(*(long *)(piVar1 + 6) + (long)(fd / 0x40) * 8);
      }
    }
    return 0;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/select.c"
             ,0x130,"(events & EV_SIGNAL) == 0","select_del");
}

Assistant:

static int
select_del(struct event_base *base, int fd, short old, short events, void *p)
{
	struct selectop *sop = base->evbase;
	(void)p;

	EVUTIL_ASSERT((events & EV_SIGNAL) == 0);
	check_selectop(sop);

	if (sop->event_fds < fd) {
		check_selectop(sop);
		return (0);
	}

	if (events & EV_READ)
		FD_CLR(fd, sop->event_readset_in);

	if (events & EV_WRITE)
		FD_CLR(fd, sop->event_writeset_in);

	check_selectop(sop);
	return (0);
}